

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_uescape_key(void)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int __fd;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar7;
  ulong uVar8;
  bool bVar9;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t *bson_euro;
  _Bool r;
  bson_t b;
  bson_error_t error;
  uint local_3e8;
  uint local_3bc;
  uint local_3b8;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_290 [648];
  
  uVar4 = bson_bcon_magic();
  pcVar5 = bcon_ensure_const_char_ptr("euro");
  lVar6 = bcon_new(0,anon_var_dwarf_344b + 0xc,uVar4,0,pcVar5);
  bVar2 = bson_init_from_json(local_380,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,local_290);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x787,"test_bson_json_uescape_key","r");
    abort();
  }
  __buf = (void *)bson_get_data(local_380);
  __buf_00 = (void *)bson_get_data(lVar6);
  local_3bc = 0xffffffff;
  bVar9 = true;
  if (*(uint *)(lVar6 + 4) == local_37c) {
    __s1 = (void *)bson_get_data(lVar6);
    __s2 = (void *)bson_get_data(local_380);
    iVar3 = memcmp(__s1,__s2,(ulong)*(uint *)(lVar6 + 4));
    bVar9 = iVar3 != 0;
  }
  if (!bVar9) {
    bson_destroy(local_380);
    bson_destroy(lVar6);
    return;
  }
  uVar4 = bson_as_canonical_extended_json(local_380,0);
  uVar7 = bson_as_canonical_extended_json(lVar6,0);
  local_3b8 = 0;
  while( true ) {
    bVar9 = false;
    if (local_3b8 < local_37c) {
      bVar9 = local_3b8 < *(uint *)(lVar6 + 4);
    }
    if (!bVar9) goto LAB_00130c60;
    if (*(char *)((long)__buf + (ulong)local_3b8) != *(char *)((long)__buf_00 + (ulong)local_3b8))
    break;
    local_3b8 = local_3b8 + 1;
  }
  local_3bc = local_3b8;
LAB_00130c60:
  if (local_3bc == 0xffffffff) {
    if (local_37c < *(uint *)(lVar6 + 4)) {
      local_3e8 = *(uint *)(lVar6 + 4);
    }
    else {
      local_3e8 = local_37c;
    }
    local_3bc = local_3e8 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_3bc,uVar4,uVar7);
  iVar3 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar3 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x788,"test_bson_json_uescape_key","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x788,"test_bson_json_uescape_key","fd2 != -1");
    abort();
  }
  uVar8 = write(iVar3,__buf,(ulong)local_37c);
  if (local_37c == uVar8) {
    uVar1 = *(uint *)(lVar6 + 4);
    uVar8 = write(__fd,__buf_00,(ulong)*(uint *)(lVar6 + 4));
    if (uVar1 == uVar8) {
      close(iVar3);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x788,"test_bson_json_uescape_key","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x788,"test_bson_json_uescape_key",
            "(bson_euro)->len == bson_write (fd2, expected_data, (bson_euro)->len)");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x788,"test_bson_json_uescape_key","(&b)->len == bson_write (fd1, bson_data, (&b)->len)");
  abort();
}

Assistant:

static void
test_bson_json_uescape_key (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   bson_t *bson_euro = BCON_NEW ("\xE2\x82\xAC", BCON_UTF8 ("euro"));

   r = bson_init_from_json (&b, "{ \"\\u20AC\": \"euro\"}", -1, &error);
   BSON_ASSERT (r);
   bson_eq_bson (&b, bson_euro);

   bson_destroy (&b);
   bson_destroy (bson_euro);
}